

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_exception.hxx
# Opt level: O0

void __thiscall
nuraft::rpc_exception::rpc_exception(rpc_exception *this,string *err,ptr<req_msg> *req)

{
  char *pcVar1;
  shared_ptr<nuraft::req_msg> *in_RDX;
  exception *in_RDI;
  shared_ptr<nuraft::req_msg> *in_stack_ffffffffffffff98;
  allocator local_19 [25];
  
  std::exception::exception(in_RDI);
  *(undefined ***)in_RDI = &PTR__rpc_exception_006e1cd8;
  std::shared_ptr<nuraft::req_msg>::shared_ptr(in_RDX,in_stack_ffffffffffffff98);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 0x18),pcVar1,local_19);
  std::allocator<char>::~allocator((allocator<char> *)local_19);
  return;
}

Assistant:

rpc_exception(const std::string& err, ptr<req_msg> req)
        : req_(req), err_(err.c_str()) {}